

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

bool_t ExprIsIntEx(tchar_t **p,wchar_t Size,intptr_t *Out)

{
  char cVar1;
  bool_t bVar2;
  bool bVar3;
  bool_t Neg;
  bool_t Pos;
  intptr_t v;
  tchar_t *s;
  intptr_t *Out_local;
  wchar_t Size_local;
  tchar_t **p_local;
  
  v = (intptr_t)*p;
  Pos = 0;
  cVar1 = *(char *)v;
  if ((cVar1 == '-') || (*(char *)v == '+')) {
    v = v + 1;
  }
  bVar2 = IsDigit((int)*(char *)v);
  Out_local._4_4_ = Size;
  if (bVar2 == 0) {
    p_local = (tchar_t **)0x0;
  }
  else {
    do {
      Pos = Pos * 10 + (long)(*(char *)v + -0x30);
      Out_local._4_4_ = Out_local._4_4_ + L'\xffffffff';
      bVar3 = false;
      if (Out_local._4_4_ != L'\0') {
        bVar2 = IsDigit((int)*(char *)(v + 1));
        bVar3 = bVar2 != 0;
        v = v + 1;
      }
    } while (bVar3);
    if (Out_local._4_4_ == L'\0') {
      if (cVar1 == '-') {
        Pos = -Pos;
      }
      *Out = Pos;
      *p = (tchar_t *)(v + 1);
      p_local = (tchar_t **)0x1;
    }
    else {
      p_local = (tchar_t **)0x0;
    }
  }
  return (bool_t)p_local;
}

Assistant:

NOINLINE bool_t ExprIsIntEx(const tchar_t** p,int Size,intptr_t* Out)
{
    const tchar_t* s = *p;
    intptr_t v = 0;

    bool_t Pos = *s == '+';
    bool_t Neg = *s == '-';
    if (Neg || Pos) ++s;

    if (!IsDigit(*s))
        return 0;

    do
    {
        v = v*10 + (*s-'0');
    }
    while (--Size && IsDigit(*(++s)));

    if (Size!=0)
        return 0;

    if (Neg)
        v = -v;

    *Out = v;
    *p = s+1;
    return 1;
}